

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent
          (PathTypeHandlerWithAttr *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  ObjectSlotAttributes *attributes;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  EquivalentPropertyEntry *entry;
  ulong uVar4;
  
  uVar3 = (ulong)record->propertyCount;
  bVar2 = true;
  if (uVar3 != 0) {
    attributes = (this->attributes).ptr;
    entry = record->properties;
    bVar1 = PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
                      ((PathTypeHandlerBase *)this,type,attributes,entry);
    uVar4 = 0;
    bVar2 = false;
    if (bVar1) {
      uVar4 = 0;
      do {
        entry = entry + 1;
        if (uVar3 - 1 == uVar4) {
          return true;
        }
        bVar2 = PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
                          ((PathTypeHandlerBase *)this,type,attributes,entry);
        uVar4 = uVar4 + 1;
      } while (bVar2);
      bVar2 = uVar3 <= uVar4;
    }
    *failedPropertyIndex = (uint)uVar4;
  }
  return bVar2;
}

Assistant:

bool PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        return IsObjTypeSpecEquivalentHelper(type, attributes, record, failedPropertyIndex);
    }